

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

void __thiscall UTF16Test_encode_codepoint_Test::TestBody(UTF16Test_encode_codepoint_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  char *pcVar2;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_40;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_30;
  
  jessilib::encode_codepoint_u16_abi_cxx11_((wchar32)&local_30);
  local_40._M_len = 1;
  local_40._M_str = L"";
  testing::internal::
  CmpHelperEQ<std::__cxx11::u16string,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_50,"encode_codepoint_u16(U\'\\0\')","u\"\\0\"sv",&local_30,&local_40);
  paVar1 = &local_30.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  jessilib::encode_codepoint_u16_abi_cxx11_((wchar32)&local_30);
  local_40._M_len = 1;
  local_40._M_str = L"A";
  testing::internal::
  CmpHelperEQ<std::__cxx11::u16string,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_50,"encode_codepoint_u16(U\'A\')","u\"A\"sv",&local_30,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  jessilib::encode_codepoint_u16_abi_cxx11_((wchar32)&local_30);
  local_40._M_len = 1;
  local_40._M_str = L"z";
  testing::internal::
  CmpHelperEQ<std::__cxx11::u16string,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_50,"encode_codepoint_u16(U\'z\')","u\"z\"sv",&local_30,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  jessilib::encode_codepoint_u16_abi_cxx11_((wchar32)&local_30);
  local_40._M_len = 1;
  local_40._M_str = L"\x7f";
  testing::internal::
  CmpHelperEQ<std::__cxx11::u16string,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_50,"encode_codepoint_u16(U\'\\u007F\')","u\"\\u007F\"sv",&local_30,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  jessilib::encode_codepoint_u16_abi_cxx11_((wchar32)&local_30);
  local_40._M_len = 1;
  local_40._M_str = L"\x80";
  testing::internal::
  CmpHelperEQ<std::__cxx11::u16string,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_50,"encode_codepoint_u16(U\'\\u0080\')","u\"\\u0080\"sv",&local_30,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  jessilib::encode_codepoint_u16_abi_cxx11_((wchar32)&local_30);
  local_40._M_len = 1;
  local_40._M_str = L"߿";
  testing::internal::
  CmpHelperEQ<std::__cxx11::u16string,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_50,"encode_codepoint_u16(U\'\\u07FF\')","u\"\\u07FF\"sv",&local_30,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  jessilib::encode_codepoint_u16_abi_cxx11_((wchar32)&local_30);
  local_40._M_len = 1;
  local_40._M_str = L"ࠀ";
  testing::internal::
  CmpHelperEQ<std::__cxx11::u16string,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_50,"encode_codepoint_u16(U\'\\u0800\')","u\"\\u0800\"sv",&local_30,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  jessilib::encode_codepoint_u16_abi_cxx11_((wchar32)&local_30);
  local_40._M_len = 1;
  local_40._M_str = L"\xffff";
  testing::internal::
  CmpHelperEQ<std::__cxx11::u16string,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_50,"encode_codepoint_u16(U\'\\uFFFF\')","u\"\\uFFFF\"sv",&local_30,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  jessilib::encode_codepoint_u16_abi_cxx11_((wchar32)&local_30);
  local_40._M_len = 2;
  local_40._M_str = L"𐀀";
  testing::internal::
  CmpHelperEQ<std::__cxx11::u16string,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_50,"encode_codepoint_u16(U\'\\U00010000\')","u\"\\U00010000\"sv",&local_30,
             &local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  jessilib::encode_codepoint_u16_abi_cxx11_((wchar32)&local_30);
  local_40._M_len = 2;
  local_40._M_str = L"\x0010ffff";
  testing::internal::
  CmpHelperEQ<std::__cxx11::u16string,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_50,"encode_codepoint_u16(U\'\\U0010FFFF\')","u\"\\U0010FFFF\"sv",&local_30,
             &local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  jessilib::encode_codepoint_u16_abi_cxx11_((wchar32)&local_30);
  local_40._M_len = 2;
  local_40._M_str = L"😄";
  testing::internal::
  CmpHelperEQ<std::__cxx11::u16string,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_50,"encode_codepoint_u16(U\'\\U0001F604\')","u\"\\U0001F604\"sv",&local_30,
             &local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_30._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST(UTF16Test, encode_codepoint) {
	EXPECT_EQ(encode_codepoint_u16(U'\0'), u"\0"sv);
	EXPECT_EQ(encode_codepoint_u16(U'A'), u"A"sv);
	EXPECT_EQ(encode_codepoint_u16(U'z'), u"z"sv);
	EXPECT_EQ(encode_codepoint_u16(U'\u007F'), u"\u007F"sv);
	EXPECT_EQ(encode_codepoint_u16(U'\u0080'), u"\u0080"sv);
	EXPECT_EQ(encode_codepoint_u16(U'\u07FF'), u"\u07FF"sv);
	EXPECT_EQ(encode_codepoint_u16(U'\u0800'), u"\u0800"sv);
	EXPECT_EQ(encode_codepoint_u16(U'\uFFFF'), u"\uFFFF"sv);
	EXPECT_EQ(encode_codepoint_u16(U'\U00010000'), u"\U00010000"sv);
	EXPECT_EQ(encode_codepoint_u16(U'\U0010FFFF'), u"\U0010FFFF"sv);
	EXPECT_EQ(encode_codepoint_u16(U'\U0001F604'), u"\U0001F604"sv);
}